

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

LPCSTR __thiscall Func::GetVtableName(Func *this,INT_PTR address)

{
  char *__s1;
  int iVar1;
  VtableHashMap *this_00;
  char **ppcVar2;
  LPCSTR pCVar3;
  char *local_20;
  INT_PTR local_18;
  INT_PTR address_local;
  
  this_00 = this->vtableMap;
  local_18 = address;
  if (this_00 == (VtableHashMap *)0x0) {
    this_00 = VirtualTableRegistry::CreateVtableHashMap(&this->m_alloc->super_ArenaAllocator);
    this->vtableMap = this_00;
  }
  local_20 = (char *)0x0;
  ppcVar2 = JsUtil::
            BaseDictionary<long,_const_char_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::LookupWithKey<long>(this_00,&local_18,&local_20);
  __s1 = *ppcVar2;
  if (__s1 == (char *)0x0) {
    pCVar3 = (LPCSTR)0x0;
  }
  else {
    iVar1 = strncmp(__s1,"class ",6);
    pCVar3 = __s1 + 6;
    if (iVar1 != 0) {
      pCVar3 = __s1;
    }
  }
  return pCVar3;
}

Assistant:

LPCSTR
Func::GetVtableName(INT_PTR address)
{
#if DBG
    if (vtableMap == nullptr)
    {
        vtableMap = VirtualTableRegistry::CreateVtableHashMap(this->m_alloc);
    };
    LPCSTR name = vtableMap->Lookup(address, nullptr);
    if (name)
    {
         if (strncmp(name, "class ", _countof("class ") - 1) == 0)
         {
             name += _countof("class ") - 1;
         }
    }
    return name;
#else
    return "";
#endif
}